

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

column_t __thiscall duckdb::Binding::GetBindingIndex(Binding *this,string *column_name)

{
  bool bVar1;
  InternalException *this_00;
  allocator local_61;
  column_t result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = TryGetBindingIndex(this,column_name,&result);
  if (bVar1) {
    return result;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Binding index for column \"%s\" not found",&local_61);
  ::std::__cxx11::string::string((string *)&local_58,(string *)column_name);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

column_t Binding::GetBindingIndex(const string &column_name) {
	column_t result;
	if (!TryGetBindingIndex(column_name, result)) {
		throw InternalException("Binding index for column \"%s\" not found", column_name);
	}
	return result;
}